

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Export * __thiscall wasm::Module::addExport(Module *this,Export *curr)

{
  Export *pEVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"addExport","");
  pEVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>,wasm::Export>
                     (&this->exports,&this->exportsMap,curr,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pEVar1;
}

Assistant:

Export* Module::addExport(Export* curr) {
  return addModuleElement(exports, exportsMap, curr, "addExport");
}